

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

char * __thiscall HttpResponse::getResponseString(HttpResponse *this)

{
  char *pcVar1;
  HttpResponse *this_local;
  
  if (this->mResponseCode == -1) {
    jh_log_print(1,"const char *HttpResponse::getResponseString() const",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                 ,0x68,"called after destruction with mResponseCode (%d)",
                 (ulong)(uint)this->mResponseCode);
  }
  else if ((this->mResponseCode < 100) || (599 < this->mResponseCode)) {
    jh_log_print(0,"const char *HttpResponse::getResponseString() const",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                 ,0x6c,"unexpected mResponseCode (%d)",(ulong)(uint)this->mResponseCode);
  }
  pcVar1 = getResponseString(this,this->mResponseCode);
  return pcVar1;
}

Assistant:

const char *HttpResponse::getResponseString() const
{
	if (mResponseCode == -1)
	{
		LOG_ERR_FATAL("called after destruction with mResponseCode (%d)",
					  mResponseCode);
	}
	else if (mResponseCode < 100 or mResponseCode > 599)
	{
		LOG_ERR("unexpected mResponseCode (%d)", mResponseCode);
	}

	return getResponseString( mResponseCode );
}